

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int x25519_key_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,
                       ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  int iVar1;
  uint8_t *pub;
  uint8_t priv [32];
  
  if (peerkey.len == 0x20) {
    pub = (uint8_t *)malloc(0x20);
    if (pub != (uint8_t *)0x0) {
      x25519_create_keypair(priv,pub);
      iVar1 = x25519_derive_secret(secret,(uint8_t *)0x0,peerkey.base,priv,pub);
      if (iVar1 == 0) {
        pubkey->base = pub;
        pubkey->len = 0x20;
        iVar1 = 0;
      }
      goto LAB_0011ce8c;
    }
    iVar1 = 0x201;
  }
  else {
    iVar1 = 0x33;
  }
  pub = (uint8_t *)0x0;
LAB_0011ce8c:
  (*ptls_clear_memory)(priv,0x20);
  if (iVar1 != 0 && pub != (uint8_t *)0x0) {
    (*ptls_clear_memory)(pub,0x20);
  }
  return iVar1;
}

Assistant:

static int x25519_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret,
                               ptls_iovec_t peerkey)
{
    uint8_t priv[X25519_KEY_SIZE], *pub = NULL;
    int ret;

    if (peerkey.len != X25519_KEY_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((pub = malloc(X25519_KEY_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    x25519_create_keypair(priv, pub);
    if ((ret = x25519_derive_secret(secret, NULL, peerkey.base, priv, pub)) != 0)
        goto Exit;

    *pubkey = ptls_iovec_init(pub, X25519_KEY_SIZE);
    ret = 0;

Exit:
    ptls_clear_memory(priv, sizeof(priv));
    if (pub != NULL && ret != 0)
        ptls_clear_memory(pub, X25519_KEY_SIZE);
    return ret;
}